

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdldl_interface.c
# Opt level: O0

void free_linsys_solver_qdldl(qdldl_solver *s)

{
  void *in_RDI;
  
  if (in_RDI != (void *)0x0) {
    if (*(long *)((long)in_RDI + 0x30) != 0) {
      csc_spfree((csc *)0x276618);
    }
    if (*(long *)((long)in_RDI + 0x40) != 0) {
      free(*(void **)((long)in_RDI + 0x40));
    }
    if (*(long *)((long)in_RDI + 0x38) != 0) {
      free(*(void **)((long)in_RDI + 0x38));
    }
    if (*(long *)((long)in_RDI + 0x48) != 0) {
      free(*(void **)((long)in_RDI + 0x48));
    }
    if (*(long *)((long)in_RDI + 0x50) != 0) {
      free(*(void **)((long)in_RDI + 0x50));
    }
    if (*(long *)((long)in_RDI + 0x58) != 0) {
      free(*(void **)((long)in_RDI + 0x58));
    }
    if (*(long *)((long)in_RDI + 0x80) != 0) {
      free(*(void **)((long)in_RDI + 0x80));
    }
    if (*(long *)((long)in_RDI + 0x90) != 0) {
      csc_spfree((csc *)0x2766cc);
    }
    if (*(long *)((long)in_RDI + 0x98) != 0) {
      free(*(void **)((long)in_RDI + 0x98));
    }
    if (*(long *)((long)in_RDI + 0xa0) != 0) {
      free(*(void **)((long)in_RDI + 0xa0));
    }
    if (*(long *)((long)in_RDI + 0xa8) != 0) {
      free(*(void **)((long)in_RDI + 0xa8));
    }
    if (*(long *)((long)in_RDI + 0xb0) != 0) {
      free(*(void **)((long)in_RDI + 0xb0));
    }
    if (*(long *)((long)in_RDI + 0xb8) != 0) {
      free(*(void **)((long)in_RDI + 0xb8));
    }
    if (*(long *)((long)in_RDI + 0xc0) != 0) {
      free(*(void **)((long)in_RDI + 0xc0));
    }
    if (*(long *)((long)in_RDI + 200) != 0) {
      free(*(void **)((long)in_RDI + 200));
    }
    if (*(long *)((long)in_RDI + 0xd0) != 0) {
      free(*(void **)((long)in_RDI + 0xd0));
    }
    if (*(long *)((long)in_RDI + 0xd8) != 0) {
      free(*(void **)((long)in_RDI + 0xd8));
    }
    free(in_RDI);
  }
  return;
}

Assistant:

void free_linsys_solver_qdldl(qdldl_solver *s) {
    if (s) {
        if (s->L)           csc_spfree(s->L);
        if (s->P)           c_free(s->P);
        if (s->Dinv)        c_free(s->Dinv);
        if (s->bp)          c_free(s->bp);
        if (s->sol)         c_free(s->sol);
        if (s->rho_inv_vec) c_free(s->rho_inv_vec);

        // These are required for matrix updates
        if (s->Pdiag_idx) c_free(s->Pdiag_idx);
        if (s->KKT)       csc_spfree(s->KKT);
        if (s->PtoKKT)    c_free(s->PtoKKT);
        if (s->AtoKKT)    c_free(s->AtoKKT);
        if (s->rhotoKKT)  c_free(s->rhotoKKT);

        // QDLDL workspace
        if (s->D)         c_free(s->D);
        if (s->etree)     c_free(s->etree);
        if (s->Lnz)       c_free(s->Lnz);
        if (s->iwork)     c_free(s->iwork);
        if (s->bwork)     c_free(s->bwork);
        if (s->fwork)     c_free(s->fwork);
        c_free(s);

    }
}